

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * util::text_word_wrap(string *__return_storage_ptr__,string *string,int width)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)string);
  iVar2 = 0;
  for (uVar4 = 0; uVar4 < __return_storage_ptr__->_M_string_length; uVar4 = uVar4 + 1) {
    uVar3 = (ulong)(byte)(__return_storage_ptr__->_M_dataplus)._M_p[uVar4];
    iVar1 = 0;
    if ((uVar3 != 0x20) &&
       (iVar1 = iVar2 + *(int *)(sizes + uVar3 * 4), width < iVar2 + *(int *)(sizes + uVar3 * 4))) {
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)(uVar4 - 1));
      iVar1 = 0;
    }
    iVar2 = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string text_word_wrap(const std::string& string, int width)
{
	int length = 0;
	std::string result(string);

	for (std::size_t i = 0; i < result.length(); ++i)
	{
		if (result[i] == ' ')
		{
			length = 0;
		}
		else
		{
			length += sizes[result[i] & 0xFF];

			if (length > width)
			{
				result.insert(i - 1, " ");
				length = 0;
			}
		}
	}

	return result;
}